

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.h
# Opt level: O2

_vector3<float> * __thiscall xray_re::_vector3<float>::min(_vector3<float> *this,_vector3<float> *v)

{
  float fVar1;
  
  fVar1 = (v->field_0).field_0.x;
  if (fVar1 <= (this->field_0).field_0.x) {
    (this->field_0).field_0.x = fVar1;
  }
  fVar1 = (v->field_0).field_0.y;
  if (fVar1 <= (this->field_0).field_0.y) {
    (this->field_0).field_0.y = fVar1;
  }
  fVar1 = (v->field_0).field_0.z;
  if (fVar1 <= (this->field_0).field_0.z) {
    (this->field_0).field_0.z = fVar1;
  }
  return this;
}

Assistant:

inline _vector3<T>& _vector3<T>::min(const _vector3<T>& v)
{
	if (x >= v.x)
		x = v.x;
	if (y >= v.y)
		y = v.y;
	if (z >= v.z)
		z = v.z;
	return *this;
}